

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::inputMethodEvent(QTextEdit *this,QInputMethodEvent *e)

{
  QTextEditPrivate::sendControlEvent
            (*(QTextEditPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,(QEvent *)e);
  if (((*(long *)(e + 0x20) == 0) && (*(long *)(e + 0x38) == 0)) && (*(long *)(e + 0x50) == 0)) {
    return;
  }
  (**(code **)(**(long **)(*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                     field_0x8 + 0x2f8) + 0x60))();
  return;
}

Assistant:

void QTextEdit::inputMethodEvent(QInputMethodEvent *e)
{
    Q_D(QTextEdit);
#ifdef QT_KEYPAD_NAVIGATION
    if (d->control->textInteractionFlags() & Qt::TextEditable
        && QApplicationPrivate::keypadNavigationEnabled()
        && !hasEditFocus())
        setEditFocus(true);
#endif
    d->sendControlEvent(e);
    const bool emptyEvent = e->preeditString().isEmpty() && e->commitString().isEmpty()
                         && e->attributes().isEmpty();
    if (emptyEvent)
        return;
    ensureCursorVisible();
}